

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_function.cpp
# Opt level: O0

size_t count_words(string *input)

{
  byte bVar1;
  bool bVar2;
  runtime_error *this;
  istream *piVar3;
  string local_250 [8];
  string word;
  size_t local_230;
  size_t words;
  long local_218;
  ifstream fin;
  string *input_local;
  
  std::ifstream::ifstream(&local_218,(string *)input,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_250);
    local_230 = 0;
    while( true ) {
      piVar3 = std::operator>>((istream *)&local_218,local_250);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      local_230 = local_230 + 1;
    }
    std::__cxx11::string::~string(local_250);
    std::ifstream::~ifstream(&local_218);
    return local_230;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Open input file failed!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t count_words(const std::string& input)
{
    std::ifstream fin(input, std::ios::binary);
    if (!fin)
    {
        throw std::runtime_error("Open input file failed!");
    }

    size_t words;
    std::string word;
    for (words = 0; fin >> word; ++words)
        ;

    return words;
}